

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O0

wstring * __thiscall
mjs::(anonymous_namespace)::to_radix_string_inner_abi_cxx11_
          (wstring *__return_storage_ptr__,_anonymous_namespace_ *this,double x,int radix,
          bool int_part)

{
  bool bVar1;
  int __y;
  double dVar2;
  allocator<wchar_t> local_a1;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_a0;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_98 [3];
  double local_80;
  double n;
  double rem;
  wstring local_68 [4];
  int iter;
  wstring res;
  char digits [37];
  bool int_part_local;
  double dStack_18;
  int radix_local;
  double x_local;
  
  __y = (int)this;
  bVar1 = std::isfinite(x);
  if (!bVar1 || x <= 0.0) {
    __assert_fail("std::isfinite(x) && x > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                  ,0x39,
                  "std::wstring mjs::(anonymous namespace)::to_radix_string_inner(double, int, bool)"
                 );
  }
  memcpy((void *)((long)&res.field_2 + 8),"0123456789abcdefghijklmnopqrstuvwxyz",0x25);
  std::__cxx11::wstring::wstring(local_68);
  rem._4_4_ = 0x44c;
  dStack_18 = x;
  do {
    rem._4_4_ = rem._4_4_ + -1;
    if (rem._4_4_ == 0) break;
    if ((radix & 1U) == 0) {
      if (1.0 < dStack_18) {
        __assert_fail("x <= 1.0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                      ,0x47,
                      "std::wstring mjs::(anonymous namespace)::to_radix_string_inner(double, int, bool)"
                     );
      }
      local_80 = dStack_18 * (double)__y;
      dVar2 = floor(local_80);
      n = std::fmod<double,int>(dVar2,__y);
      local_80 = local_80 - n;
    }
    else {
      bVar1 = false;
      if (0.0 < dStack_18) {
        dVar2 = floor(dStack_18);
        bVar1 = dStack_18 == dVar2;
      }
      if (!bVar1) {
        __assert_fail("x > 0.0 && x == std::floor(x)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                      ,0x43,
                      "std::wstring mjs::(anonymous namespace)::to_radix_string_inner(double, int, bool)"
                     );
      }
      n = std::fmod<double,int>(dStack_18,__y);
      local_80 = (dStack_18 - n) / (double)__y;
    }
    if (n < 0.0 || (double)__y <= n) {
      __assert_fail("rem >= 0 && rem < radix",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                    ,0x4d,
                    "std::wstring mjs::(anonymous namespace)::to_radix_string_inner(double, int, bool)"
                   );
    }
    std::__cxx11::wstring::operator+=(local_68,(int)digits[(long)(int)n + -8]);
    dStack_18 = local_80;
  } while ((local_80 != 0.0) || (NAN(local_80)));
  if ((radix & 1U) == 0) {
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,local_68);
  }
  else {
    std::__cxx11::wstring::crbegin();
    std::__cxx11::wstring::crend();
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::
    wstring<std::reverse_iterator<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>,void>
              ((wstring *)__return_storage_ptr__,local_98,&local_a0,&local_a1);
    std::allocator<wchar_t>::~allocator(&local_a1);
  }
  std::__cxx11::wstring::~wstring(local_68);
  return __return_storage_ptr__;
}

Assistant:

std::wstring to_radix_string_inner(double x, int radix, bool int_part) {
    assert(std::isfinite(x) && x > 0);
    constexpr const char digits[37] = "0123456789abcdefghijklmnopqrstuvwxyz";
    std::wstring res;
    int iter = 1100;
    do {
        if (!--iter) {
            break;
        }
        double rem, n;
        if (int_part) {
            assert(x > 0.0 && x == std::floor(x));
            rem = std::fmod(x, radix);
            n   = (x - rem) / radix;
        } else {
            assert(x <= 1.0);
            n = x*radix;
            rem = std::fmod(std::floor(n), radix);
            n -= rem;
        }

        assert(rem >= 0 && rem < radix);
        res += digits[static_cast<int>(rem)];
        x = n;

    } while (x != 0.0);

    return int_part ? std::wstring(res.crbegin(), res.crend()) : res;
}